

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O1

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPropertyPattern
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *ppos,UErrorCode *ec)

{
  ushort uVar1;
  _func_int *p_Var2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined1 *puVar7;
  undefined7 uVar9;
  char16_t *pcVar8;
  short sVar10;
  int32_t iVar11;
  bool bVar12;
  int32_t pos;
  UnicodeString propName;
  UnicodeString valueName;
  uint local_100;
  byte local_f9;
  undefined4 local_f8;
  undefined4 local_f4;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_100 = ppos->index;
  if (U_ZERO_ERROR < *ec) {
    return this;
  }
  uVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  puVar7 = (undefined1 *)(ulong)(uint)(int)(short)uVar1;
  if ((short)uVar1 < 0) {
    uVar5 = *(uint *)((long)&pattern->fUnion + 4);
  }
  else {
    uVar5 = (int)(short)uVar1 >> 5;
  }
  if ((int)uVar5 < (int)(local_100 + 5)) goto LAB_002c04ec;
  bVar12 = true;
  if (local_100 < uVar5) {
    if ((uVar1 & 2) == 0) {
      pcVar8 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if ((pcVar8[(int)local_100] == L'[') && (local_100 + 1 < uVar5)) {
      bVar12 = pcVar8[(long)(int)local_100 + 1] != L':';
    }
  }
  if (bVar12 == false) {
    local_100 = local_100 + 2;
    local_f8 = 0;
    local_100 = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar10 < 0) {
      uVar5 = (pattern->fUnion).fFields.fLength;
    }
    else {
      uVar5 = (int)sVar10 >> 5;
    }
    local_f4 = 0;
    if (local_100 < uVar5 && (int)local_100 < (int)uVar5) {
      if (((int)sVar10 & 2U) == 0) {
        pcVar8 = (pattern->fUnion).fFields.fArray;
      }
      else {
        pcVar8 = (char16_t *)((long)&pattern->fUnion + 2);
      }
      local_f8 = 0;
      local_f4 = 0;
      if (pcVar8[(int)local_100] == L'^') {
        local_100 = local_100 + 1;
        local_f4 = (undefined4)CONCAT71((uint7)(uint3)(local_100 >> 8),1);
        local_f8 = 0;
      }
    }
  }
  else {
    if (uVar5 <= local_100) goto LAB_002c04ec;
    if ((uVar1 & 2) == 0) {
      pcVar8 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if (((pcVar8[(int)local_100] != L'\\') || (uVar5 <= local_100 + 1)) ||
       ((pcVar8[(long)(int)local_100 + 1] & 0xffdfU) != 0x50)) {
      if (uVar5 <= local_100) goto LAB_002c04ec;
      if ((uVar1 & 2) == 0) {
        pcVar8 = (pattern->fUnion).fFields.fArray;
      }
      else {
        pcVar8 = (char16_t *)((long)&pattern->fUnion + 2);
      }
      if (((pcVar8[(int)local_100] != L'\\') || (uVar5 <= local_100 + 1)) ||
         (pcVar8[(long)(int)local_100 + 1] != L'N')) goto LAB_002c04ec;
    }
    sVar10 = -1;
    if (local_100 + 1 < uVar5) {
      if ((uVar1 & 2) == 0) {
        puVar7 = *(undefined1 **)((long)&pattern->fUnion + 0x10);
      }
      else {
        puVar7 = &(pattern->fUnion).fFields.field_0x2;
      }
      sVar10 = *(short *)(puVar7 + (long)(int)(local_100 + 1) * 2);
    }
    uVar9 = (undefined7)((ulong)puVar7 >> 8);
    local_f4 = (undefined4)CONCAT71(uVar9,sVar10 == 0x50);
    local_f8 = (undefined4)CONCAT71(uVar9,sVar10 == 0x4e);
    local_100 = local_100 + 2;
    uVar5 = ICU_Utility::skipWhitespace(pattern,(int32_t *)&local_100,'\0');
    sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar10 < 0) {
      uVar4 = (pattern->fUnion).fFields.fLength;
    }
    else {
      uVar4 = (int)sVar10 >> 5;
    }
    if ((uVar5 == uVar4) || (local_100 = uVar5 + 1, uVar4 <= uVar5)) goto LAB_002c04ec;
    if (((int)sVar10 & 2U) == 0) {
      pcVar8 = (pattern->fUnion).fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&pattern->fUnion + 2);
    }
    if (pcVar8[(int)uVar5] != L'{') goto LAB_002c04ec;
  }
  local_f9 = bVar12;
  if (bVar12 == false) {
    if ((int)local_100 < 0) {
      uVar5 = 0;
    }
    else {
      sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
      if (sVar10 < 0) {
        uVar4 = (pattern->fUnion).fFields.fLength;
      }
      else {
        uVar4 = (int)sVar10 >> 5;
      }
      uVar5 = local_100;
      if ((int)uVar4 < (int)local_100) {
        uVar5 = uVar4;
      }
    }
    sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar10 < 0) {
      iVar11 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar11 = (int)sVar10 >> 5;
    }
    uVar5 = UnicodeString::indexOf(pattern,L":]",0,2,uVar5,iVar11 - uVar5);
  }
  else {
    if ((int)local_100 < 0) {
      uVar5 = 0;
    }
    else {
      sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
      if (sVar10 < 0) {
        uVar4 = (pattern->fUnion).fFields.fLength;
      }
      else {
        uVar4 = (int)sVar10 >> 5;
      }
      uVar5 = local_100;
      if ((int)uVar4 < (int)local_100) {
        uVar5 = uVar4;
      }
    }
    sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar10 < 0) {
      iVar6 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar10 >> 5;
    }
    uVar5 = UnicodeString::doIndexOf(pattern,L'}',uVar5,iVar6 - uVar5);
  }
  if (-1 < (int)uVar5) {
    if ((int)local_100 < 0) {
      uVar4 = 0;
    }
    else {
      sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
      if (sVar10 < 0) {
        uVar3 = (pattern->fUnion).fFields.fLength;
      }
      else {
        uVar3 = (int)sVar10 >> 5;
      }
      uVar4 = local_100;
      if ((int)uVar3 < (int)local_100) {
        uVar4 = uVar3;
      }
    }
    sVar10 = (pattern->fUnion).fStackFields.fLengthAndFlags;
    if (sVar10 < 0) {
      iVar6 = (pattern->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar10 >> 5;
    }
    uVar4 = UnicodeString::doIndexOf(pattern,L'=',uVar4,iVar6 - uVar4);
    local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
    local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
    local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b5258;
    local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
    p_Var2 = (pattern->super_Replaceable).super_UObject._vptr_UObject[3];
    if (uVar4 < uVar5 && (char)local_f8 == '\0') {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar4,&local_f0);
      (*(pattern->super_Replaceable).super_UObject._vptr_UObject[3])
                (pattern,(ulong)(uVar4 + 1),(ulong)uVar5,&local_b0);
    }
    else {
      (*p_Var2)(pattern,(ulong)local_100,(ulong)uVar5);
      if ((char)local_f8 != '\0') {
        UnicodeString::operator=(&local_b0,&local_f0);
        UnicodeString::UnicodeString(&local_70,"na",2,kInvariant);
        UnicodeString::moveFrom(&local_f0,&local_70);
        UnicodeString::~UnicodeString(&local_70);
      }
    }
    applyPropertyAlias(this,&local_f0,&local_b0,ec);
    if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((char)local_f4 != '\0') {
        complement(this);
      }
      ppos->index = (uVar5 - local_f9) + 2;
    }
    UnicodeString::~UnicodeString(&local_b0);
    UnicodeString::~UnicodeString(&local_f0);
    return this;
  }
LAB_002c04ec:
  *ec = U_ILLEGAL_ARGUMENT_ERROR;
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPropertyPattern(const UnicodeString& pattern,
                                             ParsePosition& ppos,
                                             UErrorCode &ec) {
    int32_t pos = ppos.getIndex();

    UBool posix = FALSE; // true for [:pat:], false for \p{pat} \P{pat} \N{pat}
    UBool isName = FALSE; // true for \N{pat}, o/w false
    UBool invert = FALSE;

    if (U_FAILURE(ec)) return *this;

    // Minimum length is 5 characters, e.g. \p{L}
    if ((pos+5) > pattern.length()) {
        FAIL(ec);
    }

    // On entry, ppos should point to one of the following locations:
    // Look for an opening [:, [:^, \p, or \P
    if (isPOSIXOpen(pattern, pos)) {
        posix = TRUE;
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos < pattern.length() && pattern.charAt(pos) == COMPLEMENT) {
            ++pos;
            invert = TRUE;
        }
    } else if (isPerlOpen(pattern, pos) || isNameOpen(pattern, pos)) {
        UChar c = pattern.charAt(pos+1);
        invert = (c == UPPER_P);
        isName = (c == UPPER_N);
        pos += 2;
        pos = ICU_Utility::skipWhitespace(pattern, pos);
        if (pos == pattern.length() || pattern.charAt(pos++) != OPEN_BRACE) {
            // Syntax error; "\p" or "\P" not followed by "{"
            FAIL(ec);
        }
    } else {
        // Open delimiter not seen
        FAIL(ec);
    }

    // Look for the matching close delimiter, either :] or }
    int32_t close;
    if (posix) {
      close = pattern.indexOf(POSIX_CLOSE, 2, pos);
    } else {
      close = pattern.indexOf(CLOSE_BRACE, pos);
    }
    if (close < 0) {
        // Syntax error; close delimiter missing
        FAIL(ec);
    }

    // Look for an '=' sign.  If this is present, we will parse a
    // medium \p{gc=Cf} or long \p{GeneralCategory=Format}
    // pattern.
    int32_t equals = pattern.indexOf(EQUALS, pos);
    UnicodeString propName, valueName;
    if (equals >= 0 && equals < close && !isName) {
        // Equals seen; parse medium/long pattern
        pattern.extractBetween(pos, equals, propName);
        pattern.extractBetween(equals+1, close, valueName);
    }

    else {
        // Handle case where no '=' is seen, and \N{}
        pattern.extractBetween(pos, close, propName);
            
        // Handle \N{name}
        if (isName) {
            // This is a little inefficient since it means we have to
            // parse NAME_PROP back to UCHAR_NAME even though we already
            // know it's UCHAR_NAME.  If we refactor the API to
            // support args of (UProperty, char*) then we can remove
            // NAME_PROP and make this a little more efficient.
            valueName = propName;
            propName = UnicodeString(NAME_PROP, NAME_PROP_LENGTH, US_INV);
        }
    }

    applyPropertyAlias(propName, valueName, ec);

    if (U_SUCCESS(ec)) {
        if (invert) {
            complement();
        }
            
        // Move to the limit position after the close delimiter if the
        // parse succeeded.
        ppos.setIndex(close + (posix ? 2 : 1));
    }

    return *this;
}